

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::OrderedArgumentSyntax::getChild(OrderedArgumentSyntax *this,size_t index)

{
  TokenOrSyntax *in_RDX;
  nullptr_t in_RSI;
  SyntaxNode *in_RDI;
  SyntaxNode *this_00;
  
  if (in_RDX == (TokenOrSyntax *)0x0) {
    this_00 = in_RDI;
    not_null<slang::syntax::PropertyExprSyntax_*>::get
              ((not_null<slang::syntax::PropertyExprSyntax_*> *)((long)in_RSI + 0x18));
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)this_00,in_RDI);
    in_RDI = this_00;
  }
  else {
    TokenOrSyntax::TokenOrSyntax(in_RDX,in_RSI);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax OrderedArgumentSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return expr.get();
        default: return nullptr;
    }
}